

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_goto_attributes(coda_cursor_conflict *cursor)

{
  coda_backend format_00;
  coda_type_record *pcVar1;
  coda_type *local_20;
  coda_format format;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_20 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_20 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  format_00 = local_20->format;
  cursor->n = cursor->n + 1;
  pcVar1 = coda_type_empty_record(format_00);
  cursor->stack[cursor->n + -1].type = (coda_dynamic_type_struct *)pcVar1;
  cursor->stack[cursor->n + -1].index = -1;
  cursor->stack[cursor->n + -1].bit_offset = -1;
  return 0;
}

Assistant:

int coda_ascbin_cursor_goto_attributes(coda_cursor *cursor)
{
    coda_format format = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->format;

    cursor->n++;
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)coda_type_empty_record(format);
    /* we use the special index value '-1' to indicate that we are pointing to the attributes of the parent */
    cursor->stack[cursor->n - 1].index = -1;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* virtual types do not have a bit offset */

    return 0;
}